

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFileDup(char *oname,char *iname,size_t skip,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  bool_t bVar3;
  file_t file;
  file_t file_00;
  blob_t buf;
  size_t sVar4;
  size_t c;
  size_t local_40;
  size_t local_38;
  
  local_40 = count;
  file = fileOpen(iname,"rb");
  eVar2 = 0xcb;
  if (file != (file_t)0x0) {
    bVar1 = fileSeek(file,skip,0);
    if (bVar1 == 0) {
      fileClose(file);
      eVar2 = 0xcf;
    }
    else {
      file_00 = fileOpen(oname,"wb");
      if (file_00 != (file_t)0x0) {
        buf = blobCreate(0x1000);
        if (buf == (blob_t)0x0) {
          fileClose(file_00);
          fileClose(file);
          return 0x6e;
        }
        if (local_40 == 0) {
          eVar2 = 0;
        }
        else if (local_40 == 0xffffffffffffffff) {
          do {
            local_40 = fileRead2(buf,0x1000,file);
            if (local_40 == 0xffffffffffffffff) {
              eVar2 = 0xcf;
            }
            else {
              eVar2 = fileWrite(&local_40,buf,local_40,file_00);
            }
          } while ((local_40 != 0) && (eVar2 == 0));
        }
        else {
          do {
            local_38 = local_40;
            if (0xfff < local_40) {
              local_38 = 0x1000;
            }
            sVar4 = fileRead2(buf,local_38,file);
            eVar2 = 0xcf;
            if (sVar4 == local_38) {
              eVar2 = fileWrite(&local_38,buf,local_38,file_00);
            }
            local_40 = local_40 - local_38;
          } while ((local_40 != 0) && (eVar2 == 0));
        }
        blobClose(buf);
        bVar1 = fileClose(file_00);
        if (eVar2 == 0) {
          bVar3 = fileClose(file);
          if (bVar1 == 0) {
            return 0x67;
          }
          if (bVar3 == 0) {
            return 0x67;
          }
          return 0;
        }
      }
      fileClose(file);
    }
  }
  return eVar2;
}

Assistant:

err_t cmdFileDup(const char* oname, const char* iname, size_t skip,
	size_t count)
{
	const size_t buf_size = 4096;
	err_t code;
	file_t ifile;
	file_t ofile;
	void* buf;
	// pre
	ASSERT(strIsValid(iname) && strIsValid(oname));
	// открыть входной файл
	code = cmdFileOpen(ifile, iname, "rb");
	ERR_CALL_CHECK(code);
	// пропустить skip октетов
	if (!fileSeek(ifile, skip, SEEK_SET))
	{
		cmdFileClose(ifile);
		return ERR_FILE_READ;
	}
	// открыть выходной файл
	code = cmdFileOpen(ofile, oname, "wb");
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	// подготовить память
	code = cmdBlobCreate(buf, buf_size);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	// дублировать count октетов
	if (count != SIZE_MAX)
		while (count && code == ERR_OK)
		{
			size_t c = MIN2(buf_size, count);
			if (fileRead2(buf, c, ifile) != c)
				code = ERR_FILE_READ;
			else
				code = fileWrite(&c, buf, c, ofile);
			count -= c;
		}
	// дублировать все
	else
		while (count && code == ERR_OK)
		{
			count = fileRead2(buf, buf_size, ifile);
			if (count == SIZE_MAX)
				code = ERR_FILE_READ;
			else 
				code = fileWrite(&count, buf, count, ofile);
		}
	// завершить
	cmdBlobClose(buf);
	ERR_CALL_HANDLE(code, (cmdFileClose(ofile), cmdFileClose(ifile)));
	code = cmdFileClose(ofile);
	ERR_CALL_HANDLE(code, cmdFileClose(ifile));
	return cmdFileClose(ifile);
}